

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::GetBbrDataset
          (CommissionerImpl *this,Handler<BbrDataset> *aHandler,uint16_t aDatasetFlags)

{
  char cVar1;
  ErrorCode EVar2;
  int iVar3;
  Error *pEVar4;
  function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)> *this_00;
  char *pcVar5;
  char *pcVar6;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  string sStack_1e8;
  undefined1 local_1c8 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1c0;
  writer write;
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  parse_func local_170 [1];
  ByteArray datasetList;
  Error error;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_e0 [40];
  Request request;
  
  this_01 = &sStack_1e8;
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  coap::Message::Message(&request,kConfirmable,kPost);
  GetBbrDatasetTlvs(&datasetList,aDatasetFlags);
  std::function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)>::function
            (&onResponse.aHandler,aHandler);
  iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar3 == '\0') {
    local_198._0_4_ = none_type;
    local_190._M_p = "the commissioner is not active";
    local_188 = 0x1e;
    local_180._M_allocated_capacity = 0;
    local_170[0] = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_180._8_8_ = (format_string_checker<char> *)local_198;
    while (pcVar6 = pcVar5, pcVar6 != "") {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_198);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_198;
    ::fmt::v10::vformat_abi_cxx11_(&sStack_1e8,(v10 *)0x1f85d8,(string_view)ZEXT816(0x1e),args);
    local_1c8._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)&local_1c0,(string *)&sStack_1e8);
LAB_0017523a:
    Error::operator=(&error,(Error *)local_1c8);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  else {
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 == '\0') {
      local_198._0_4_ = none_type;
      local_190._M_p = "sending MGMT_BBR_GET.req is only valid in CCM mode";
      local_188 = 0x32;
      local_180._M_allocated_capacity = 0;
      local_170[0] = (parse_func)0x0;
      pcVar5 = "sending MGMT_BBR_GET.req is only valid in CCM mode";
      write.handler_ = (format_string_checker<char> *)local_198;
      local_180._8_8_ = (format_string_checker<char> *)local_198;
      while (pcVar5 != "") {
        cVar1 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar1 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar5,"");
            goto LAB_00175209;
          }
          cVar1 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_198);
      }
LAB_00175209:
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_198;
      ::fmt::v10::vformat_abi_cxx11_
                (&sStack_1e8,(v10 *)"sending MGMT_BBR_GET.req is only valid in CCM mode",
                 (string_view)ZEXT816(0x32),args_00);
      local_1c8._0_4_ = kInvalidState;
      std::__cxx11::string::string((string *)&local_1c0,(string *)&sStack_1e8);
      goto LAB_0017523a;
    }
    std::__cxx11::string::string((string *)local_1c8,"/c/bg",(allocator *)&sStack_1e8);
    coap::Message::SetUriPath((Error *)local_198,&request,(string *)local_1c8);
    pEVar4 = Error::operator=(&error,(Error *)local_198);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)local_1c8);
    if (EVar2 != kNone) goto LAB_0017525c;
    if (datasetList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        datasetList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      tlv::Tlv::Tlv((Tlv *)local_1c8,kGet,&datasetList,kMeshCoP);
      AppendTlv((Error *)local_198,&request,(Tlv *)local_1c8);
      pEVar4 = Error::operator=(&error,(Error *)local_198);
      EVar2 = pEVar4->mCode;
      std::__cxx11::string::~string((string *)&local_190);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c0);
      if (EVar2 != kNone) goto LAB_0017525c;
    }
    local_118 = (code *)0x0;
    pcStack_110 = (code *)0x0;
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    this_00 = (function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)> *)
              operator_new(0x20);
    std::function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)>::function
              (this_00,&onResponse.aHandler);
    pcStack_110 = std::
                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:824:23)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:824:23)>
                ::_M_manager;
    local_128._M_unused._M_object = this_00;
    ProxyClient::SendRequest
              (&this->mProxyClient,&request,(ResponseHandler *)&local_128,0xfc00,0xf0bf);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    std::__cxx11::string::string((string *)local_1c8,"mgmt",(allocator *)&write);
    local_198._0_4_ = none_type;
    local_190._M_p = "sent MGMT_BBR_GET.req";
    local_188 = 0x15;
    local_180._M_allocated_capacity = 0;
    local_170[0] = (parse_func)0x0;
    pcVar5 = "sent MGMT_BBR_GET.req";
    local_180._8_8_ = (format_string_checker<char> *)local_198;
    while (pcVar6 = pcVar5, pcVar6 != "") {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_198);
      }
    }
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_198;
    ::fmt::v10::vformat_abi_cxx11_
              (&sStack_1e8,(v10 *)"sent MGMT_BBR_GET.req",(string_view)ZEXT816(0x15),args_01);
    Log(kDebug,(string *)local_1c8,&sStack_1e8);
    std::__cxx11::string::~string((string *)&sStack_1e8);
    this_01 = (string *)local_1c8;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_0017525c:
  if (error.mCode != kNone) {
    Error::Error((Error *)local_e0,&error);
    std::function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)>::operator()
              (aHandler,(BbrDataset *)0x0,(Error *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&onResponse);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&datasetList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  coap::Message::~Message(&request);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::GetBbrDataset(Handler<BbrDataset> aHandler, uint16_t aDatasetFlags)
{
    Error error;

    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    ByteArray     datasetList = GetBbrDatasetTlvs(aDatasetFlags);

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error      error;
        BbrDataset dataset;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        SuccessOrExit(error = DecodeBbrDataset(dataset, *aResponse));

        aHandler(&dataset, error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("sending MGMT_BBR_GET.req is only valid in CCM mode"));

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtBbrGet));

    if (!datasetList.empty())
    {
        SuccessOrExit(error = AppendTlv(request, {tlv::Type::kGet, datasetList}));
    }

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_BBR_GET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}